

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::auxForward(Graph *this,Vertex *vertex,Edge *edge,int it)

{
  bool bVar1;
  int iVar2;
  ostream *this_00;
  Vertex *pVVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  __type _Var7;
  __type _Var8;
  __type _Var9;
  byte local_71;
  Edge *local_68;
  Edge *aux;
  double somaReAtiv;
  double somaAtiv;
  double reactiveLossCharge;
  double activeLossCharge;
  double reactive_power;
  double active_power;
  Edge *e;
  int it_local;
  Edge *edge_local;
  Vertex *vertex_local;
  Graph *this_local;
  
  if (vertex == (Vertex *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"\n No NULL \n");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    for (active_power = (double)Vertex::getEdgesList(vertex); active_power != 0.0;
        active_power = (double)Edge::getNext((Edge *)active_power)) {
      reactive_power = 0.0;
      activeLossCharge = 0.0;
      while( true ) {
        local_71 = 0;
        if (active_power != 0.0) {
          bVar1 = Edge::isClosed((Edge *)active_power);
          local_71 = bVar1 ^ 0xff;
        }
        if ((local_71 & 1) == 0) break;
        Edge::setActiveFlow((Edge *)active_power,0.0);
        Edge::setReactiveFlow((Edge *)active_power,0.0);
        Edge::setActiveLoss((Edge *)active_power,0.0);
        Edge::setReactiveLoss((Edge *)active_power,0.0);
        active_power = (double)Edge::getNext((Edge *)active_power);
      }
      if (active_power == 0.0) {
        return;
      }
      if (vertex == this->verticesList) {
        pVVar3 = Edge::getDestiny((Edge *)active_power);
        dVar4 = branchActiveLoss(this,pVVar3);
        pVVar3 = Edge::getDestiny((Edge *)active_power);
        dVar5 = branchReactiveLoss(this,pVVar3);
        dVar6 = Edge::getActiveLoss((Edge *)active_power);
        Edge::setActiveFlow((Edge *)active_power,dVar4 + dVar6);
        dVar4 = Edge::getReactiveLoss((Edge *)active_power);
        Edge::setReactiveFlow((Edge *)active_power,dVar5 + dVar4);
      }
      else {
        if (0 < it) {
          dVar4 = Edge::getResistance(edge);
          dVar5 = Edge::getActivePowerFlow(edge);
          _Var7 = std::pow<double,int>(dVar5,2);
          dVar5 = Edge::getReactivePowerFlow(edge);
          _Var8 = std::pow<double,int>(dVar5,2);
          pVVar3 = Edge::getOrigin(edge);
          dVar5 = Vertex::getVoltage(pVVar3);
          _Var9 = std::pow<double,int>(dVar5,2);
          reactive_power = (dVar4 * (_Var7 + _Var8)) / _Var9;
          dVar4 = Edge::getReactance(edge);
          dVar5 = Edge::getActivePowerFlow(edge);
          _Var7 = std::pow<double,int>(dVar5,2);
          dVar5 = Edge::getReactivePowerFlow(edge);
          _Var8 = std::pow<double,int>(dVar5,2);
          pVVar3 = Edge::getOrigin(edge);
          dVar5 = Vertex::getVoltage(pVVar3);
          _Var9 = std::pow<double,int>(dVar5,2);
          activeLossCharge = (dVar4 * (_Var7 + _Var8)) / _Var9;
        }
        dVar4 = Edge::getActivePowerFlow(edge);
        dVar5 = Vertex::getActivePower(vertex);
        Edge::setActiveFlow((Edge *)active_power,(dVar4 - reactive_power) - dVar5);
        dVar4 = Edge::getReactivePowerFlow(edge);
        dVar5 = Vertex::getReactivePower(vertex);
        Edge::setReactiveFlow((Edge *)active_power,(dVar4 - activeLossCharge) - dVar5);
        pVVar3 = Edge::getOrigin((Edge *)active_power);
        iVar2 = Vertex::getIndegree(pVVar3);
        if (1 < iVar2) {
          somaReAtiv = 0.0;
          aux = (Edge *)0x0;
          for (local_68 = Vertex::getEdgesList(vertex); local_68 != (Edge *)0x0;
              local_68 = Edge::getNext(local_68)) {
            if ((local_68 != (Edge *)active_power) && (bVar1 = Edge::isClosed(local_68), bVar1)) {
              dVar4 = Edge::getActiveLoss(local_68);
              pVVar3 = Edge::getDestiny(local_68);
              dVar5 = branchActiveLoss(this,pVVar3);
              somaReAtiv = dVar4 + dVar5 + somaReAtiv;
              dVar4 = Edge::getReactiveLoss(local_68);
              pVVar3 = Edge::getDestiny(local_68);
              dVar5 = branchReactiveLoss(this,pVVar3);
              aux = (Edge *)(dVar4 + dVar5 + (double)aux);
            }
          }
          dVar4 = Edge::getActivePowerFlow((Edge *)active_power);
          Edge::setActiveFlow((Edge *)active_power,dVar4 - somaReAtiv);
          dVar4 = Edge::getReactivePowerFlow((Edge *)active_power);
          Edge::setReactiveFlow((Edge *)active_power,dVar4 - (double)aux);
        }
      }
      pVVar3 = Edge::getDestiny((Edge *)active_power);
      auxForward(this,pVVar3,(Edge *)active_power,it);
    }
  }
  return;
}

Assistant:

void Graph::auxForward(Vertex *vertex, Edge *edge, int it){
    if(vertex == NULL)
        cout<<"\n No NULL \n"<<endl;
    else{
        for(Edge *e = vertex->getEdgesList(); e!=NULL; e= e->getNext()){

            double active_power     = 0.0;
            double reactive_power   = 0.0;

            /// set open edges with flow-free
            while(e!=NULL && !e->isClosed() ){

                e->setActiveFlow(0.0);
                e->setReactiveFlow(0.0);
                e->setActiveLoss(0.0);
                e->setReactiveLoss(0.0);

                e = e->getNext();
            }
            if(e==NULL)
                break;

            //chute inicial para o fluxo nas arests que partem do no terminal
            if( vertex==this->verticesList ) {
                double activeLossCharge = branchActiveLoss(e->getDestiny());
                double reactiveLossCharge = branchReactiveLoss(e->getDestiny());

                e->setActiveFlow(activeLossCharge + e->getActiveLoss());
                e->setReactiveFlow(reactiveLossCharge + e->getReactiveLoss());

            } else {
                //a partir da primeira iteracao considera-se a perda calculada na iteracao anterior
                if(it>0){
                    active_power = edge->getResistance()*(pow(edge->getActivePowerFlow(), 2) + pow(edge->getReactivePowerFlow(), 2)) / pow(
                            edge->getOrigin()->getVoltage(), 2);    // Q = R*P^2 + Q^2/V^2
                    reactive_power =
                            edge->getReactance()*(pow(edge->getActivePowerFlow(), 2) + pow(edge->getReactivePowerFlow(), 2)) / pow(
                                    edge->getOrigin()->getVoltage(), 2);
                }

                e->setActiveFlow(edge->getActivePowerFlow() - active_power - vertex->getActivePower());
                e->setReactiveFlow(edge->getReactivePowerFlow() - reactive_power - vertex->getReactivePower());

                //bifurcacao - o fluxo que seque para o arco 'a' deve-se subtrair a soma de cargas e perdas dos ramos de bifurcacoes
                if(e->getOrigin()->getIndegree()>1){
                    double somaAtiv=0.0, somaReAtiv=0.0;
                    for(Edge *aux= vertex->getEdgesList(); aux!=NULL; aux= aux->getNext()){
                        if(aux!=e && aux->isClosed()==true){
                            somaAtiv+= aux->getActiveLoss() + branchActiveLoss(aux->getDestiny());
                            somaReAtiv+= aux->getReactiveLoss() + branchReactiveLoss(aux->getDestiny());
                        }
                    }

                    e->setActiveFlow(e->getActivePowerFlow() - somaAtiv);
                    e->setReactiveFlow(e->getReactivePowerFlow() - somaReAtiv);
                }
            }

            auxForward(e->getDestiny(), e, it);
        }
    }
}